

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbeddedClasses.cpp
# Opt level: O2

void chatra::Dict::native_keys
               (NativeCallHandler handler,Thread *thread,ObjectBase *object,StringId name,
               StringId subName,Tuple *args,Reference ret)

{
  Array *pAVar1;
  String *this;
  long lVar2;
  vector<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  *pvVar3;
  string local_68;
  Reference local_48;
  Reference ret_local;
  
  local_48.node = ret.node;
  SpinLock::lock((SpinLock *)(object + 1));
  ret_local.node =
       (ReferenceNode *)
       object[1].super_Object.groups.
       super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pAVar1 = Reference::allocateWithoutLock<chatra::Array,unsigned_long>
                     (&local_48,(unsigned_long *)&ret_local);
  pvVar3 = &object[1].super_Object.groups;
  lVar2 = 0;
  while (pvVar3 = (vector<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
                   *)(pvVar3->
                     super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
        pvVar3 != (vector<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
                   *)0x0) {
    ret_local.node =
         *(ReferenceNode **)
          (*(long *)&(((pAVar1->super_ContainerBase).super_ObjectBase.super_Object.refsArray.
                       super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                       _M_impl.super__Vector_impl_data._M_start)->node->object->refsArray).
                     super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                     _M_impl.super__Vector_impl_data + lVar2);
    this = Reference::allocateWithoutLock<chatra::String>(&ret_local);
    std::__cxx11::string::string
              ((string *)&local_68,
               (string *)
               &(pvVar3->
                super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish);
    String::setValue(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    lVar2 = lVar2 + 8;
  }
  ((__atomic_flag_base *)&object[1].super_Object._vptr_Object)->_M_i = false;
  return;
}

Assistant:

void Dict::native_keys(CHATRA_NATIVE_ARGS) {
	CHATRA_NATIVE_SELF;
	std::lock_guard<SpinLock> lock(self.lockValue);

	auto& retValue = ret.allocate<Array>(self.keyToIndex.size());
	size_t index = 0;
	for (auto& e : self.keyToIndex)
		retValue.container().ref(index++).allocate<String>().setValue(e.first);
}